

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genFixeds
          (DefaultSampling<int> *this,FloatFormat *param_1,vector<int,_std::allocator<int>_> *dst)

{
  int local_14 [3];
  
  local_14[2] = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(dst,local_14 + 2);
  local_14[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(dst,local_14 + 1);
  local_14[0] = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(dst,local_14);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat&, vector<int>& dst) const
	{
		dst.push_back(0);
		dst.push_back(-1);
		dst.push_back(1);
	}